

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

bool __thiscall
QGraphicsAnchorLayoutPrivate::simplifyGraphIteration
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation,bool *feasible)

{
  QGraphicsLayoutItem *pQVar1;
  uint uVar2;
  qsizetype qVar3;
  AnchorData *pAVar4;
  iterator iVar5;
  AnchorData *pAVar6;
  Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *pNVar7;
  AnchorData *pAVar8;
  SequentialAnchorData *this_00;
  SequentialAnchorData *pSVar9;
  AnchorVertex **ppAVar10;
  size_t __n;
  ulong uVar11;
  bool bVar12;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_01;
  byte bVar13;
  long in_FS_OFFSET;
  bool bVar14;
  bool newFeasible;
  AnchorVertex *after;
  AnchorData *local_e0;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> *local_d8;
  AnchorData *local_d0;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_b0;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> local_98;
  QArrayData *local_78;
  undefined8 uStack_70;
  long local_68;
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> local_60;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> local_58;
  qsizetype local_48;
  AnchorData *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  local_60.d = (Data *)0x0;
  local_78 = (QArrayData *)0x0;
  uStack_70 = 0;
  local_68 = 0;
  local_58.first = (AnchorVertex *)0x0;
  local_58.second = (AnchorVertex *)(this->graph).m_data[(long)(int)orientation + 1].m_graph.d;
  QtPrivate::
  QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
  ::
  emplace<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>const&>
            ((QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
              *)&local_78,0,&local_58);
  local_d8 = (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> *
             )QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
              ::end((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                     *)&local_78);
  local_98.d = (Data *)0x0;
  local_98.ptr = (AnchorVertex **)0x0;
  local_98.size = 0;
  bVar13 = 0;
  if (local_68 != 0) {
    this_01 = (this->graph).m_data + (long)(int)orientation + -1;
    do {
      iVar5 = QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
              ::end((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                     *)&local_78);
      local_e0 = (AnchorData *)iVar5.i[-1].first;
      pAVar8 = (AnchorData *)iVar5.i[-1].second;
      local_68 = local_68 + -1;
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
      adjacentVertices(&local_b0,this_01,(AnchorVertex *)pAVar8);
      bVar14 = (QGraphicsLayoutItem *)(pAVar8->super_QSimplexVariable).result == pQVar1;
      bVar12 = bVar14 || local_b0.d.size != 2U;
      local_d0 = pAVar8;
      if (!bVar14 && local_b0.d.size == 2U) {
        pAVar6 = local_e0;
        if (local_98.size != 0) {
          pAVar6 = (AnchorData *)local_98.ptr[local_98.size + -1];
        }
        ppAVar10 = local_b0.d.ptr + (local_b0.d.size - 1);
        if (pAVar6 == (AnchorData *)local_b0.d.ptr[local_b0.d.size - 1]) {
          ppAVar10 = local_b0.d.ptr;
        }
        local_40 = (AnchorData *)*ppAVar10;
        pAVar6 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
                 edgeData(this_01,(AnchorVertex *)pAVar8,(AnchorVertex *)local_40);
        if (local_60.d == (Data *)0x0) {
          bVar14 = false;
        }
        else {
          pNVar7 = QHashPrivate::
                   Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>::
                   findNode<QtGraphicsAnchorLayout::AnchorVertex*>
                             ((Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>
                               *)local_60.d,(AnchorVertex **)&local_40);
          bVar14 = pNVar7 != (Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *)0x0;
        }
        pAVar4 = local_40;
        bVar12 = true;
        if (!bVar14) {
          bVar12 = (bool)((pAVar6->field_0x78 & 8) >> 3);
        }
        if (bVar12 == false) {
          local_58.first = (AnchorVertex *)pAVar8;
          QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*>::
          emplace<QtGraphicsAnchorLayout::AnchorVertex*&>
                    ((QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*> *)&local_98,local_98.size,
                     &local_58.first);
          QList<QtGraphicsAnchorLayout::AnchorVertex_*>::end
                    ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_98);
        }
        else if ((bVar14) && (local_e0 != local_40)) {
          local_58.first = (AnchorVertex *)pAVar8;
          QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*>::
          emplace<QtGraphicsAnchorLayout::AnchorVertex*&>
                    ((QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*> *)&local_98,local_98.size,
                     &local_58.first);
          QList<QtGraphicsAnchorLayout::AnchorVertex_*>::end
                    ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_98);
          local_d0 = pAVar4;
        }
      }
      if (local_b0.d.size != 0) {
        uVar11 = 0;
        do {
          local_40 = (AnchorData *)local_b0.d.ptr[uVar11];
          if ((local_60.d == (Data *)0x0) ||
             (pNVar7 = QHashPrivate::
                       Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>
                       ::findNode<QtGraphicsAnchorLayout::AnchorVertex*>
                                 ((Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>
                                   *)local_60.d,(AnchorVertex **)&local_40),
             pNVar7 == (Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *)0x0)) {
            local_58.first = (AnchorVertex *)local_e0;
            if (bVar12 != false) {
              local_58.first = (AnchorVertex *)pAVar8;
            }
            local_58.second = (AnchorVertex *)local_40;
            QtPrivate::
            QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
            ::
            emplace<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>const&>
                      ((QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
                        *)&local_78,local_68,&local_58);
            QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
            ::end((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                   *)&local_78);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)local_b0.d.size);
      }
      local_58.first = (AnchorVertex *)pAVar8;
      QHash<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue> *)&local_60,
                 &local_58.first,(QHashDummyValue *)&local_40);
      bVar14 = false;
      if ((bVar12 != false) && (local_98.size != 0)) {
        pAVar8 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
                 edgeData(this_01,(AnchorVertex *)local_e0,*local_98.ptr);
        if ((pAVar8->field_0x78 & 8) != 0) {
          local_e0 = (AnchorData *)*local_98.ptr;
          if ((&(local_98.d)->super_QArrayData == (QArrayData *)0x0) ||
             (1 < ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::reallocateAndGrow
                      (&local_98,GrowsAtEnd,0,
                       (QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x0);
          }
          if (local_98.size != 1) {
            local_98.ptr = local_98.ptr + 1;
          }
          local_98.size = local_98.size + -1;
          if (local_98.size == 0) goto LAB_005cbad8;
        }
        pAVar8 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
                 edgeData(this_01,local_98.ptr[local_98.size + -1],(AnchorVertex *)local_d0);
        qVar3 = local_98.size;
        if ((pAVar8->field_0x78 & 8) != 0) {
          local_d0 = (AnchorData *)local_98.ptr[local_98.size + -1];
          if ((&(local_98.d)->super_QArrayData == (QArrayData *)0x0) ||
             (1 < ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::reallocateAndGrow
                      (&local_98,GrowsAtEnd,0,
                       (QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x0);
          }
          ppAVar10 = local_98.ptr + qVar3;
          if ((local_98.size * 8 == qVar3 * 8 || local_98.ptr != local_98.ptr + qVar3 + -1) &&
             (__n = local_98.size * 8 + qVar3 * -8, ppAVar10 = local_98.ptr, __n != 0)) {
            memmove(local_98.ptr + qVar3 + -1,local_98.ptr + qVar3,__n);
            ppAVar10 = local_98.ptr;
          }
          local_98.ptr = ppAVar10;
          local_98.size = local_98.size + -1;
          if (local_98.size == 0) goto LAB_005cbad8;
        }
        local_58.first = (AnchorVertex *)0x0;
        local_58.second = (AnchorVertex *)0x0;
        local_48 = 0;
        QList<QtGraphicsAnchorLayout::AnchorData_*>::reserve
                  ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)&local_58,local_98.size + 1);
        uVar2 = (uint)local_98.size;
        QList<QtGraphicsAnchorLayout::AnchorData_*>::reserve
                  ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)&local_58,(long)(int)(uVar2 + 1));
        if (0 < (int)uVar2) {
          uVar11 = 0;
          pAVar8 = local_e0;
          do {
            pAVar6 = (AnchorData *)local_98.ptr[uVar11];
            local_40 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                       ::takeEdge(this_01,(AnchorVertex *)pAVar8,(AnchorVertex *)pAVar6);
            QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*>::
            emplace<QtGraphicsAnchorLayout::AnchorData*&>
                      ((QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*> *)&local_58,local_48,
                       &local_40);
            QList<QtGraphicsAnchorLayout::AnchorData_*>::end
                      ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)&local_58);
            uVar11 = uVar11 + 1;
            pAVar8 = pAVar6;
          } while ((uVar2 & 0x7fffffff) != uVar11);
        }
        local_40 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
                   takeEdge(this_01,local_98.ptr[local_98.size + -1],(AnchorVertex *)local_d0);
        QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*>::
        emplace<QtGraphicsAnchorLayout::AnchorData*&>
                  ((QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*> *)&local_58,local_48,&local_40
                  );
        QList<QtGraphicsAnchorLayout::AnchorData_*>::end
                  ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)&local_58);
        this_00 = (SequentialAnchorData *)operator_new(0x98);
        QtGraphicsAnchorLayout::SequentialAnchorData::SequentialAnchorData
                  (this_00,(QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_98,
                   (QList<QtGraphicsAnchorLayout::AnchorData_*> *)&local_58);
        (this_00->super_AnchorData).from = (AnchorVertex *)local_e0;
        (this_00->super_AnchorData).to = (AnchorVertex *)local_d0;
        QtGraphicsAnchorLayout::SequentialAnchorData::calculateSizeHints(this_00);
        if (local_58.first != (AnchorVertex *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_58.first)->_vptr_AnchorVertex)->_q_value).
          super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_58.first)->_vptr_AnchorVertex)->_q_value).
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_58.first)->_vptr_AnchorVertex)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58.first,8,0x10);
          }
        }
        local_58.first = (AnchorVertex *)CONCAT71(local_58.first._1_7_,0xaa);
        pSVar9 = (SequentialAnchorData *)
                 addAnchorMaybeParallel(this,(AnchorData *)this_00,(bool *)&local_58);
        if ((char)local_58.first == '\0') {
          *feasible = false;
          bVar14 = true;
          local_d8 = (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                      *)0x0;
        }
        else if (pSVar9 == this_00) {
          QList<QtGraphicsAnchorLayout::AnchorVertex_*>::clear
                    ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_98);
          bVar14 = false;
        }
        else {
          local_d8 = (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                      *)0x1;
          bVar14 = true;
        }
      }
LAB_005cbad8:
      if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,8,0x10);
        }
      }
      bVar13 = (byte)local_d8;
      if (bVar14) goto LAB_005cbb19;
    } while (local_68 != 0);
    bVar13 = 0;
  }
LAB_005cbb19:
  if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d)->super_QArrayData,8,0x10);
    }
  }
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,0x10,0x10);
    }
  }
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>::~QHash(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar13 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsAnchorLayoutPrivate::simplifyGraphIteration(Qt::Orientation orientation,
                                                          bool *feasible)
{
    Q_Q(QGraphicsAnchorLayout);
    Graph<AnchorVertex, AnchorData> &g = graph[orientation];

    QSet<AnchorVertex *> visited;
    QStack<std::pair<AnchorVertex *, AnchorVertex *> > stack;
    stack.push(std::pair(static_cast<AnchorVertex *>(nullptr), layoutFirstVertex[orientation]));
    QList<AnchorVertex *> candidates;

    // Walk depth-first, in the stack we store start of the candidate sequence (beforeSequence)
    // and the vertex to be visited.
    while (!stack.isEmpty()) {
        std::pair<AnchorVertex *, AnchorVertex *> pair = stack.pop();
        AnchorVertex *beforeSequence = pair.first;
        AnchorVertex *v = pair.second;

        // The basic idea is to determine whether we found an end of sequence,
        // if that's the case, we stop adding vertices to the candidate list
        // and do a simplification step.
        //
        // A vertex can trigger an end of sequence if
        // (a) it is a layout vertex, we don't simplify away the layout vertices;
        // (b) it does not have exactly 2 adjacents;
        // (c) its next adjacent is already visited (a cycle in the graph).
        // (d) the next anchor is a center anchor.

        const QList<AnchorVertex *> &adjacents = g.adjacentVertices(v);
        const bool isLayoutVertex = v->m_item == q;
        AnchorVertex *afterSequence = v;
        bool endOfSequence = false;

        //
        // Identify the end cases.
        //

        // Identifies cases (a) and (b)
        endOfSequence = isLayoutVertex || adjacents.size() != 2;

        if (!endOfSequence) {
            // This is a tricky part. We peek at the next vertex to find out whether
            //
            // - we already visited the next vertex (c);
            // - the next anchor is a center (d).
            //
            // Those are needed to identify the remaining end of sequence cases. Note that unlike
            // (a) and (b), we preempt the end of sequence by looking into the next vertex.

            // Peek at the next vertex
            AnchorVertex *after;
            if (candidates.isEmpty())
                after = (beforeSequence == adjacents.last() ? adjacents.first() : adjacents.last());
            else
                after = (candidates.constLast() == adjacents.last() ? adjacents.first() : adjacents.last());

            // ### At this point we assumed that candidates will not contain 'after', this may not hold
            // when simplifying FLOATing anchors.
            Q_ASSERT(!candidates.contains(after));

            const AnchorData *data = g.edgeData(v, after);
            Q_ASSERT(data);
            const bool cycleFound = visited.contains(after);

            // Now cases (c) and (d)...
            endOfSequence = cycleFound || data->isCenterAnchor;

            if (!endOfSequence) {
                // If it's not an end of sequence, then the vertex didn't trigger neither of the
                // previously three cases, so it can be added to the candidates list.
                candidates.append(v);
            } else if (cycleFound && (beforeSequence != after)) {
                afterSequence = after;
                candidates.append(v);
            }
        }

        //
        // Add next non-visited vertices to the stack.
        //
        for (int i = 0; i < adjacents.size(); ++i) {
            AnchorVertex *next = adjacents.at(i);
            if (visited.contains(next))
                continue;

            // If current vertex is an end of sequence, and it'll reset the candidates list. So
            // the next vertices will build candidates lists with the current vertex as 'before'
            // vertex. If it's not an end of sequence, we keep the original 'before' vertex,
            // since we are keeping the candidates list.
            if (endOfSequence)
                stack.push(std::pair(v, next));
            else
                stack.push(std::pair(beforeSequence, next));
        }

        visited.insert(v);

        if (!endOfSequence || candidates.isEmpty())
            continue;

        //
        // Create a sequence for (beforeSequence, candidates, afterSequence).
        //

        // One restriction we have is to not simplify half of an anchor and let the other half
        // unsimplified. So we remove center edges before and after the sequence.
        const AnchorData *firstAnchor = g.edgeData(beforeSequence, candidates.constFirst());
        if (firstAnchor->isCenterAnchor) {
            beforeSequence = candidates.constFirst();
            candidates.remove(0);

            // If there's not candidates to be simplified, leave.
            if (candidates.isEmpty())
                continue;
        }

        const AnchorData *lastAnchor = g.edgeData(candidates.constLast(), afterSequence);
        if (lastAnchor->isCenterAnchor) {
            afterSequence = candidates.constLast();
            candidates.remove(candidates.size() - 1);

            if (candidates.isEmpty())
                continue;
        }

        //
        // Add the sequence to the graph.
        //

        AnchorData *sequence = createSequence(&g, beforeSequence, candidates, afterSequence);

        // If 'beforeSequence' and 'afterSequence' already had an anchor between them, we'll
        // create a parallel anchor between the new sequence and the old anchor.
        bool newFeasible;
        AnchorData *newAnchor = addAnchorMaybeParallel(sequence, &newFeasible);

        if (!newFeasible) {
            *feasible = false;
            return false;
        }

        // When a new parallel anchor is create in the graph, we finish the iteration and return
        // true to indicate a new iteration is needed. This happens because a parallel anchor
        // changes the number of adjacents one vertex has, possibly opening up oportunities for
        // building candidate lists (when adjacents == 2).
        if (newAnchor != sequence)
            return true;

        // If there was no parallel simplification, we'll keep walking the graph. So we clear the
        // candidates list to start again.
        candidates.clear();
    }

    return false;
}